

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::PrintHeuristicCollectionStats(Recycler *this)

{
  byte bVar1;
  
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"GC Trigger   : %10s %10s %10s",L"Start",L"Continue",L"Finish");
  if (this->enablePartialCollect == true) {
    Output::Print(L" | Heuristics                   : %10s %10s %5s",L"",L"",L"%");
  }
  Output::Print(L"\n");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L" Alloc bytes : %10d %10d %10d",(this->collectionStats).startCollectAllocBytes,
                (this->collectionStats).continueCollectAllocBytes,
                (this->autoHeap).uncollectedAllocBytes);
  if (this->enablePartialCollect == true) {
    Output::Print(L" | Cost                         : %10d %10d %5.1f",
                  (this->collectionStats).collectCost * 100.0,
                  (this->collectionStats).rescanRootBytes,
                  (this->collectionStats).estimatedPartialReuseBytes);
  }
  Output::Print(L"\n");
  bVar1 = this->enablePartialCollect;
  if ((bool)bVar1 == true) {
    Output::Print(L"                                                | Efficacy                     : %10s %10s %5.1f\n"
                  ,(this->collectionStats).collectEfficacy * 100.0,L"");
    bVar1 = this->enablePartialCollect;
  }
  if ((bVar1 & 1) != 0) {
    Output::Print(L" New page    : %10d %10s %10d",(this->collectionStats).startCollectNewPageCount,
                  L"",(this->autoHeap).uncollectedNewPageCount);
    Output::Print(L" | Partial Uncollect New Page   : %10d %10d",
                  (this->collectionStats).uncollectedNewPageCountPartialCollect << 0xc,
                  this->uncollectedNewPageCountPartialCollect << 0xc);
    Output::Print(L"\n");
  }
  Output::Print(L" Finish try  : %10d %10s %10s",(this->collectionStats).finishCollectTryCount,L"");
  if (this->enablePartialCollect == true) {
    Output::Print(L" | Partial Reuse Min Free Bytes :            %10d",
                  (this->collectionStats).partialCollectSmallHeapBlockReuseMinFreeBytes << 0xc);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void
Recycler::PrintHeuristicCollectionStats()
{
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("GC Trigger   : %10s %10s %10s"), _u("Start"), _u("Continue"), _u("Finish"));
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" | Heuristics                   : %10s %10s %5s"), _u(""), _u(""), _u("%"));
    }
#endif
    Output::Print(_u("\n"));

    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u(" Alloc bytes : %10d %10d %10d"), collectionStats.startCollectAllocBytes, collectionStats.continueCollectAllocBytes, this->autoHeap.uncollectedAllocBytes);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" | Cost                         : %10d %10d %5.1f"), collectionStats.rescanRootBytes, collectionStats.estimatedPartialReuseBytes, collectionStats.collectCost * 100);
    }
#endif
    Output::Print(_u("\n"));

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u("                                                | Efficacy                     : %10s %10s %5.1f\n"), _u(""), _u(""), collectionStats.collectEfficacy * 100);
    }
#endif

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" New page    : %10d %10s %10d"), collectionStats.startCollectNewPageCount, _u(""), autoHeap.uncollectedNewPageCount);
        Output::Print(_u(" | Partial Uncollect New Page   : %10d %10d"), collectionStats.uncollectedNewPageCountPartialCollect * AutoSystemInfo::PageSize, this->uncollectedNewPageCountPartialCollect * AutoSystemInfo::PageSize);
        Output::Print(_u("\n"));
    }
#endif

    Output::Print(_u(" Finish try  : %10d %10s %10s"), collectionStats.finishCollectTryCount, _u(""), _u(""));
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" | Partial Reuse Min Free Bytes :            %10d"), collectionStats.partialCollectSmallHeapBlockReuseMinFreeBytes * AutoSystemInfo::PageSize);
    }
#endif
    Output::Print(_u("\n"));
}